

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.h
# Opt level: O2

bool QVersionNumber::SegmentStorage::dataFitsInline(int *data,qsizetype len)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  
  if (len < 8) {
    lVar2 = 0;
    lVar3 = 0;
    if (0 < len) {
      lVar3 = len;
    }
    do {
      if (lVar3 == lVar2) {
        return len <= lVar2;
      }
      piVar1 = data + lVar2;
      lVar2 = lVar2 + 1;
    } while ((int)(char)*piVar1 == *piVar1);
  }
  return false;
}

Assistant:

static bool dataFitsInline(const int *data, qsizetype len)
        {
            if (len > InlineSegmentCount)
                return false;
            for (qsizetype i = 0; i < len; ++i)
                if (data[i] != qint8(data[i]))
                    return false;
            return true;
        }